

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O0

void duckdb::STDDevBaseOperation::
     ConstantOperation<double,duckdb::StddevState,duckdb::VarSampOperation>
               (StddevState *state,double *input,AggregateUnaryInput *unary_input,idx_t count)

{
  StddevState *in_RCX;
  idx_t i;
  StddevState *input_00;
  
  for (input_00 = (StddevState *)0x0; input_00 < in_RCX;
      input_00 = (StddevState *)((long)&input_00->count + 1)) {
    Operation<double,duckdb::StddevState,duckdb::VarSampOperation>
              (in_RCX,(double *)input_00,(AggregateUnaryInput *)0x8173ef);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}